

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprLHitGather(Fts3Expr *pExpr,MatchInfo *p)

{
  char cVar1;
  byte bVar2;
  sqlite3_vtab *psVar3;
  Fts3Phrase *pFVar4;
  byte bVar5;
  int iVar6;
  u32 uVar7;
  uint uVar8;
  ulong in_RAX;
  ulong uVar9;
  int iVar10;
  char *pEnd;
  byte *pbVar11;
  int iVar12;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (pExpr->bEof != '\0') {
    return 0;
  }
  do {
    if (pExpr->iDocid != p->pCursor->iPrevId) {
      return 0;
    }
    if (pExpr->pLeft == (Fts3Expr *)0x0) {
      psVar3 = (p->pCursor->base).pVtab;
      pFVar4 = pExpr->pPhrase;
      pbVar11 = (byte *)(pFVar4->doclist).pList;
      uStack_38 = uStack_38 & 0xffffffff;
      cVar1 = p->flag;
      iVar6 = p->nCol;
      if (cVar1 != 'y') {
        iVar12 = iVar6 + 0x3e;
        if (-1 < iVar6 + 0x1f) {
          iVar12 = iVar6 + 0x1f;
        }
        iVar6 = iVar12 >> 5;
      }
      iVar6 = iVar6 * pExpr->iPhrase;
      iVar12 = 0;
      while( true ) {
        bVar2 = *pbVar11;
        uVar7 = 0;
        if (1 < bVar2) {
          do {
            bVar5 = bVar2 & 0x80;
            uVar7 = uVar7 + (bVar2 >> 7 ^ 1);
            bVar2 = pbVar11[1];
            pbVar11 = pbVar11 + 1;
          } while ((bVar2 & 0xfe) != 0 || bVar5 != 0);
        }
        iVar10 = pFVar4->iColumn;
        if ((iVar10 == iVar12) || (*(int *)&psVar3[2].pModule <= iVar10)) {
          if (cVar1 == 'y') {
            p->aMatchinfo[iVar12 + iVar6] = uVar7;
          }
          else if (uVar7 != 0) {
            iVar10 = iVar12 + 0x20;
            if (-1 < iVar12 + 1) {
              iVar10 = iVar12 + 1;
            }
            p->aMatchinfo[(iVar10 >> 5) + iVar6] =
                 p->aMatchinfo[(iVar10 >> 5) + iVar6] | 1 << ((byte)iVar12 & 0x1f);
          }
        }
        if (*pbVar11 != 1) break;
        bVar2 = pbVar11[1];
        if ((char)bVar2 < '\0') {
          uVar8 = sqlite3Fts3GetVarint32((char *)(pbVar11 + 1),(int *)((long)&uStack_38 + 4));
          uVar9 = (ulong)uVar8;
          iVar12 = uStack_38._4_4_;
        }
        else {
          uStack_38 = CONCAT44((int)(char)bVar2,(undefined4)uStack_38);
          uVar9 = 1;
          iVar12 = (int)(char)bVar2;
        }
        pbVar11 = pbVar11 + 1 + uVar9;
        if (p->nCol <= iVar12) {
          return 0x10b;
        }
      }
      return 0;
    }
    iVar6 = fts3ExprLHitGather(pExpr->pLeft,p);
    if (iVar6 != 0) {
      return iVar6;
    }
    pExpr = pExpr->pRight;
  } while (pExpr->bEof == '\0');
  return 0;
}

Assistant:

static int fts3ExprLHitGather(
  Fts3Expr *pExpr,
  MatchInfo *p
){
  int rc = SQLITE_OK;
  assert( (pExpr->pLeft==0)==(pExpr->pRight==0) );
  if( pExpr->bEof==0 && pExpr->iDocid==p->pCursor->iPrevId ){
    if( pExpr->pLeft ){
      rc = fts3ExprLHitGather(pExpr->pLeft, p);
      if( rc==SQLITE_OK ) rc = fts3ExprLHitGather(pExpr->pRight, p);
    }else{
      rc = fts3ExprLHits(pExpr, p);
    }
  }
  return rc;
}